

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libformula-calc.c
# Opt level: O1

rpf_t * formula_output(stack_t *num,int *sp_num,stack_t *op,int *sp_op,int rank)

{
  long lVar1;
  int iVar2;
  int iVar3;
  rpf_type_t rVar4;
  void *pvVar5;
  bool bVar6;
  rpf_type_t *prVar7;
  long lVar8;
  long lVar9;
  rpf_type_t *prVar10;
  rpf_t rpf2;
  rpf_type_t local_48 [4];
  void *local_38;
  
  lVar8 = (long)*sp_op;
  if (0 < lVar8) {
    do {
      lVar1 = lVar8 + -1;
      local_48[0] = TYPE_START;
      pvVar5 = op[lVar1].value;
      iVar2 = *(int *)((long)pvVar5 + 0x18);
      iVar3 = *sp_num;
      if (iVar3 < iVar2) {
        return (rpf_t *)0x0;
      }
      prVar10 = local_48;
      if (0 < iVar2) {
        lVar9 = (long)(iVar3 - iVar2);
        prVar10 = local_48;
        do {
          rVar4 = num[lVar9].type;
          if (rVar4 == TYPE_RPF) {
            *(void **)(prVar10 + 4) = num[lVar9].value;
            prVar7 = prVar10;
            do {
              prVar10 = prVar7;
              prVar7 = *(rpf_type_t **)(prVar10 + 4);
            } while (*(rpf_type_t **)(prVar10 + 4) != (rpf_type_t *)0x0);
          }
          else {
            prVar7 = (rpf_type_t *)malloc(0x18);
            *(rpf_type_t **)(prVar10 + 4) = prVar7;
            *prVar7 = rVar4;
            *(void **)(prVar7 + 2) = num[lVar9].value;
            prVar7[4] = TYPE_VALUE;
            prVar7[5] = TYPE_VALUE;
            prVar10 = prVar7;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < iVar3);
      }
      *sp_num = iVar3 - iVar2;
      prVar7 = (rpf_type_t *)malloc(0x18);
      *(rpf_type_t **)(prVar10 + 4) = prVar7;
      *prVar7 = op[lVar1].type;
      *(void **)(prVar7 + 2) = pvVar5;
      prVar7[4] = TYPE_VALUE;
      prVar7[5] = TYPE_VALUE;
      *sp_op = *sp_op + -1;
      num[*sp_num].rank = 0;
      num[*sp_num].type = TYPE_RPF;
      iVar2 = *sp_num;
      num[iVar2].value = local_38;
      *sp_num = iVar2 + 1;
      bVar6 = 1 < lVar8;
      lVar8 = lVar1;
    } while (bVar6);
  }
  return (rpf_t *)num[(long)*sp_num + -1].value;
}

Assistant:

struct rpf_t *formula_output(struct stack_t *num, int *sp_num, struct stack_t *op, int *sp_op, int rank)
{
  /*{
		int i;
		printf("  op ");
		for(i = 0; i < *sp_op; i++)
			printf("%s ", ((struct operation_t*)op[i].value)->op);
		printf("\n  num ");
		for(i = 0; i < *sp_num; i++)
		{
			if(num[i].type == TYPE_RPF)
				printf("rpf ");
			else
				printf("%f ", *((double*)num[i].value));
		}
		printf("\n");
	}*/

  int sp_op2;
  for (sp_op2 = *sp_op - 1; sp_op2 >= 0; sp_op2--)
  {
    struct rpf_t rpf2, *rpf2_tmp;
    int sp_num2;

    rpf2_tmp = &rpf2;
    rpf2.type = TYPE_START;

    int num_cnt;
    num_cnt = ((struct operation_t *)op[sp_op2].value)->narg;
    if (num_cnt > *sp_num)
      return NULL;
    for (sp_num2 = *sp_num - num_cnt; sp_num2 < *sp_num; sp_num2++)
    {
      switch (num[sp_num2].type)
      {
        case TYPE_RPF:
          rpf2_tmp = rpf_join(rpf2_tmp, num[sp_num2].value);
          //printf(" rpf");
          break;
        default:
          rpf2_tmp = rpf_push(rpf2_tmp, &num[sp_num2]);
          //printf("%f ", *((double*)num[sp_num2].value));
          break;
      }
    }
    //printf("\n");
    (*sp_num) -= num_cnt;
    rpf2_tmp = rpf_push(rpf2_tmp, &op[sp_op2]);
    (*sp_op)--;

    num[*sp_num].rank = 0;
    num[*sp_num].type = TYPE_RPF;
    num[*sp_num].value = rpf2.next;
    (*sp_num)++;

    //formula_print(stdout, &rpf2);
    //printf("\n");
  }
  return num[*sp_num - 1].value;
}